

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# interfaces.cpp
# Opt level: O1

void __thiscall common::anon_unknown_0::CleanupHandler::disconnect(CleanupHandler *this)

{
  function<void_()> *pfVar1;
  long lVar2;
  _Manager_type p_Var3;
  long in_FS_OFFSET;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if ((this->m_cleanup).super__Function_base._M_manager != (_Manager_type)0x0) {
    pfVar1 = &this->m_cleanup;
    (*(this->m_cleanup)._M_invoker)((_Any_data *)pfVar1);
    p_Var3 = (this->m_cleanup).super__Function_base._M_manager;
    if (p_Var3 != (_Manager_type)0x0) {
      (*p_Var3)((_Any_data *)pfVar1,(_Any_data *)pfVar1,__destroy_functor);
      if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
        (this->m_cleanup).super__Function_base._M_manager = (_Manager_type)0x0;
        (this->m_cleanup)._M_invoker = (_Invoker_type)0x0;
        return;
      }
      goto LAB_00682f27;
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar2) {
    return;
  }
LAB_00682f27:
  __stack_chk_fail();
}

Assistant:

void disconnect() override { if (!m_cleanup) return; m_cleanup(); m_cleanup = nullptr; }